

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<int>(void)

{
  int iVar1;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  undefined4 in_stack_ffffffffffffffc0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffc4;
  
  if (ConstCastTestT<int>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::w);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::w =
           ::SafeInt::operator_cast_to_wchar_t
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::w);
    }
  }
  if (ConstCastTestT<int>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::c);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::c =
           ::SafeInt::operator_cast_to_char
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::c);
    }
  }
  if (ConstCastTestT<int>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::sc);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::sc =
           ::SafeInt::operator_cast_to_signed_char
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::sc);
    }
  }
  if (ConstCastTestT<int>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::uc);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::uc =
           ::SafeInt::operator_cast_to_unsigned_char
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::uc);
    }
  }
  if (ConstCastTestT<int>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::s);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::s =
           ::SafeInt::operator_cast_to_short
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::s);
    }
  }
  if (ConstCastTestT<int>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::us);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::us =
           ::SafeInt::operator_cast_to_unsigned_short
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::us);
    }
  }
  if (ConstCastTestT<int>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::i);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::i =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::i);
    }
  }
  if (ConstCastTestT<int>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ui);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::ui =
           ::SafeInt::operator_cast_to_unsigned_int
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::ui);
    }
  }
  if (ConstCastTestT<int>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::l);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::l =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::l);
    }
  }
  if (ConstCastTestT<int>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ul);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::ul =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::ul);
    }
  }
  if (ConstCastTestT<int>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ll);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::ll =
           ::SafeInt::operator_cast_to_long_long
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::ll);
    }
  }
  if (ConstCastTestT<int>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::ull);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::ull);
    }
  }
  if (ConstCastTestT<int>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::st);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::st =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::st);
    }
  }
  if (ConstCastTestT<int>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::pt);
    if (iVar1 != 0) {
      ConstSafeInt<int>();
      ConstCastTestT<int>::pt =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(in_stack_ffffffffffffffc4.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::pt);
    }
  }
  if (ConstCastTestT<int>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<int>()::pl);
    if (iVar1 != 0) {
      SVar2 = ConstSafeInt<int>();
      SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &stack0xffffffffffffffc4);
      ConstCastTestT<int>::pl =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT44(SVar2.m_int,in_stack_ffffffffffffffc0));
      __cxa_guard_release(&ConstCastTestT<int>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}